

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void ZopfliSublenToCache(unsigned_short *sublen,size_t pos,size_t length,
                        ZopfliLongestMatchCache *lmc)

{
  uchar *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (2 < length) {
    puVar1 = lmc->sublen;
    uVar3 = 3;
    uVar5 = 0;
    uVar4 = 0;
    do {
      if ((length == uVar3) || (sublen[uVar3] != sublen[uVar3 + 1])) {
        lVar2 = uVar4 * 3;
        puVar1[lVar2 + pos * 0x18] = (char)uVar3 + 0xfd;
        puVar1[lVar2 + pos * 0x18 + 1] = (uchar)sublen[uVar3];
        puVar1[lVar2 + pos * 0x18 + 2] = *(uchar *)((long)sublen + uVar3 * 2 + 1);
        uVar4 = uVar4 + 1;
        if (7 < uVar4) {
          return;
        }
        uVar5 = uVar3 & 0xffffffff;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= length);
    if (uVar4 < 8) {
      puVar1[pos * 0x18 + 0x15] = (char)uVar5 + 0xfd;
    }
  }
  return;
}

Assistant:

void ZopfliSublenToCache(const unsigned short* sublen,
                         size_t pos, size_t length,
                         ZopfliLongestMatchCache* lmc) {
  size_t i;
  size_t j = 0;
  unsigned bestlength = 0;
  unsigned char* cache;

#if ZOPFLI_CACHE_LENGTH == 0
  return;
#endif

  cache = &lmc->sublen[ZOPFLI_CACHE_LENGTH * pos * 3];
  if (length < 3) return;
  for (i = 3; i <= length; i++) {
    if (i == length || sublen[i] != sublen[i + 1]) {
      cache[j * 3] = i - 3;
      cache[j * 3 + 1] = sublen[i] % 256;
      cache[j * 3 + 2] = (sublen[i] >> 8) % 256;
      bestlength = i;
      j++;
      if (j >= ZOPFLI_CACHE_LENGTH) break;
    }
  }
  if (j < ZOPFLI_CACHE_LENGTH) {
    assert(bestlength == length);
    cache[(ZOPFLI_CACHE_LENGTH - 1) * 3] = bestlength - 3;
  } else {
    assert(bestlength <= length);
  }
  assert(bestlength == ZopfliMaxCachedSublen(lmc, pos, length));
}